

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O0

size_t __thiscall
ikfast::IkSolutionList<double>::AddSolution
          (IkSolutionList<double> *this,
          vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
          *vinfos,vector<int,_std::allocator<int>_> *vfree)

{
  IkSolution<double> local_60;
  size_type local_28;
  size_t index;
  vector<int,_std::allocator<int>_> *vfree_local;
  vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  *vinfos_local;
  IkSolutionList<double> *this_local;
  
  index = (size_t)vfree;
  vfree_local = (vector<int,_std::allocator<int>_> *)vinfos;
  vinfos_local = (vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                  *)this;
  local_28 = std::__cxx11::
             list<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>::size
                       (&this->_listsolutions);
  IkSolution<double>::IkSolution
            (&local_60,
             (vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
              *)vfree_local,(vector<int,_std::allocator<int>_> *)index);
  std::__cxx11::list<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>::
  push_back(&this->_listsolutions,&local_60);
  IkSolution<double>::~IkSolution(&local_60);
  return local_28;
}

Assistant:

virtual size_t AddSolution(const std::vector<IkSingleDOFSolutionBase<T> >& vinfos, const std::vector<int>& vfree)
    {
        size_t index = _listsolutions.size();
        _listsolutions.push_back(IkSolution<T>(vinfos,vfree));
        return index;
    }